

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,std::__cxx11::string,kratos::Generator*,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>>
::load_impl_sequence<0ul,1ul,2ul,3ul,4ul>
          (argument_loader<pybind11::detail::value_and_holder&,std::__cxx11::string,kratos::Generator*,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>>
           *this,long call)

{
  uint uVar1;
  undefined8 *puVar2;
  bool bVar3;
  
  puVar2 = *(undefined8 **)(call + 8);
  uVar1 = **(uint **)(call + 0x20);
  *(undefined8 *)(this + 0x88) = *puVar2;
  bVar3 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  *)(this + 0x68),(PyObject *)puVar2[1],SUB41((uVar1 & 2) >> 1,0));
  if (bVar3) {
    bVar3 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                      ((type_caster_generic *)(this + 0x50),
                       *(PyObject **)(*(long *)(call + 8) + 0x10),
                       SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
    if (bVar3) {
      bVar3 = type_caster_generic::
              load_impl<pybind11::detail::copyable_holder_caster<kratos::Var,std::shared_ptr<kratos::Var>,void>>
                        ((type_caster_generic *)(this + 0x28),
                         *(PyObject **)(*(long *)(call + 8) + 0x18),
                         SUB41((**(uint **)(call + 0x20) & 8) >> 3,0));
      if (bVar3) {
        bVar3 = type_caster_generic::
                load_impl<pybind11::detail::copyable_holder_caster<kratos::Var,std::shared_ptr<kratos::Var>,void>>
                          ((type_caster_generic *)this,*(PyObject **)(*(long *)(call + 8) + 0x20),
                           SUB41((**(uint **)(call + 0x20) & 0x10) >> 4,0));
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }